

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O2

char * archive_entry_fflags_text(archive_entry *entry)

{
  char cVar1;
  archive_mstring *aes;
  wchar_t wVar2;
  int *piVar3;
  size_t sVar4;
  char *mbs;
  char *pcVar5;
  char *pcVar6;
  flag *pfVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  size_t __size;
  char *f;
  archive_entry *local_40;
  archive_mstring *local_38;
  
  wVar2 = archive_mstring_get_mbs(entry->archive,&entry->ae_fflags_text,&f);
  if (wVar2 == L'\0') {
    if (f != (char *)0x0) {
      return f;
    }
  }
  else {
    piVar3 = __errno_location();
    if (*piVar3 == 0xc) goto LAB_00126dd6;
  }
  uVar9 = entry->ae_fflags_set;
  uVar10 = entry->ae_fflags_clear;
  uVar8 = uVar9 | uVar10;
  if (uVar8 != 0) {
    __size = 0;
    local_40 = entry;
    local_38 = &entry->ae_fflags_text;
    for (pfVar7 = flags; pfVar7->name != (char *)0x0; pfVar7 = pfVar7 + 1) {
      uVar11 = pfVar7->clear | pfVar7->set;
      if ((uVar11 & uVar8) != 0) {
        sVar4 = strlen(pfVar7->name);
        __size = __size + sVar4 + 1;
        uVar8 = uVar8 & ~uVar11;
      }
    }
    if ((__size != 0) && (mbs = (char *)malloc(__size), aes = local_38, mbs != (char *)0x0)) {
      pcVar5 = mbs;
      for (pfVar7 = flags; pcVar6 = pfVar7->name, pcVar6 != (char *)0x0; pfVar7 = pfVar7 + 1) {
        uVar8 = pfVar7->set;
        uVar11 = pfVar7->clear;
        if ((uVar11 & uVar10) == 0 && (uVar8 & uVar9) == 0) {
          if ((uVar8 & uVar10) != 0 || (uVar11 & uVar9) != 0) goto LAB_00126d48;
        }
        else {
          pcVar6 = pcVar6 + 2;
LAB_00126d48:
          if (mbs < pcVar5) {
            *pcVar5 = ',';
            pcVar5 = pcVar5 + 1;
          }
          uVar9 = uVar9 & ~(uVar11 | uVar8);
          uVar10 = uVar10 & ~(uVar11 | uVar8);
          pcVar5 = pcVar5 + -1;
          do {
            cVar1 = *pcVar6;
            pcVar6 = pcVar6 + 1;
            pcVar5[1] = cVar1;
            pcVar5 = pcVar5 + 1;
          } while (cVar1 != '\0');
        }
      }
      *pcVar5 = '\0';
      archive_mstring_copy_mbs(local_38,mbs);
      free(mbs);
      wVar2 = archive_mstring_get_mbs(local_40->archive,aes,&f);
      if (wVar2 == L'\0') {
        return f;
      }
      piVar3 = __errno_location();
      if (*piVar3 == 0xc) {
LAB_00126dd6:
        __archive_errx(1,"No memory");
      }
    }
  }
  return (char *)0x0;
}

Assistant:

const char *
archive_entry_fflags_text(struct archive_entry *entry)
{
	const char *f;
	char *p;

	if (archive_mstring_get_mbs(entry->archive,
	    &entry->ae_fflags_text, &f) == 0) {
		if (f != NULL)
			return (f);
	} else if (errno == ENOMEM)
		__archive_errx(1, "No memory");

	if (entry->ae_fflags_set == 0  &&  entry->ae_fflags_clear == 0)
		return (NULL);

	p = ae_fflagstostr(entry->ae_fflags_set, entry->ae_fflags_clear);
	if (p == NULL)
		return (NULL);

	archive_mstring_copy_mbs(&entry->ae_fflags_text, p);
	free(p);
	if (archive_mstring_get_mbs(entry->archive,
	    &entry->ae_fflags_text, &f) == 0)
		return (f);
	if (errno == ENOMEM)
		__archive_errx(1, "No memory");
	return (NULL);
}